

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recorder.cpp
# Opt level: O2

void __thiscall pstore::broker::recorder::record(recorder *this,message_type *cmd)

{
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_20;
  
  std::unique_lock<std::mutex>::unique_lock(&local_20,&this->mut_);
  file::file_base::write<pstore::brokerface::message_type,void>(&(this->file_).super_file_base,cmd);
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  return;
}

Assistant:

void recorder::record (brokerface::message_type const & cmd) {
            std::unique_lock<decltype (mut_)> const lock (mut_);
            file_.write (cmd);
        }